

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::TriageCompareLineCos2Distance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *a0,Vector3<long_double> *a1,
              longdouble r2,Vector3<long_double> *n,longdouble n1,longdouble n2)

{
  uint uVar1;
  longdouble in_ST0;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  
  uVar1 = 0xffffffff;
  if (r2 < (longdouble)2.0) {
    lVar2 = (longdouble)1 + r2 * (longdouble)-0.5;
    lVar2 = lVar2 * n2 * lVar2;
    lVar5 = *(longdouble *)(x->c_ + 1) * *(longdouble *)(n->c_ + 2) -
            *(longdouble *)(x->c_ + 2) * *(longdouble *)(n->c_ + 1);
    lVar4 = *(longdouble *)(x->c_ + 2) * *(longdouble *)n->c_ -
            *(longdouble *)(n->c_ + 2) * *(longdouble *)x->c_;
    lVar3 = *(longdouble *)(n->c_ + 1) * *(longdouble *)x->c_ -
            *(longdouble *)n->c_ * *(longdouble *)(x->c_ + 1);
    lVar5 = lVar3 * lVar3 + lVar4 * lVar4 + lVar5 * lVar5;
    sqrtl();
    lVar3 = (n1 * (longdouble)5.618802153517007 + (longdouble)6.153480596427404e-15) *
            (longdouble)5.421011e-20;
    lVar4 = lVar2 * (*(longdouble *)(x->c_ + 2) * *(longdouble *)(x->c_ + 2) +
                    *(longdouble *)(x->c_ + 1) * *(longdouble *)(x->c_ + 1) +
                    *(longdouble *)x->c_ * *(longdouble *)x->c_);
    lVar3 = lVar2 * (longdouble)3.7947076e-19 + lVar4 * (longdouble)2.1684043e-19 +
            (in_ST0 + in_ST0 + lVar3) * lVar3 + lVar5 * (longdouble)1.6263033e-19;
    lVar5 = lVar5 - lVar4;
    uVar1 = 0xffffffff;
    if (lVar5 <= lVar3) {
      uVar1 = (uint)(lVar5 < -lVar3);
    }
  }
  return uVar1;
}

Assistant:

int TriageCompareLineCos2Distance(const Vector3<T>& x, const Vector3<T>& a0,
                                  const Vector3<T>& a1, T r2,
                                  const Vector3<T>& n, T n1, T n2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // The minimum distance is to a point on the edge interior.  Since the true
  // distance to the edge is always less than 90 degrees, we can return
  // immediately if the limit is 90 degrees or larger.
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise we compute cos^2(distance to edge).
  T cos_r = 1 - 0.5 * r2;
  T n2cos2_r = n2 * cos_r * cos_r;
  T n2cos2_r_error = 7 * T_ERR * n2cos2_r;

  // The length of M = X.CrossProd(N) is the cosine of the distance.
  T m2 = x.CrossProd(n).Norm2();
  T m1 = sqrt(m2);
  T m1_error = ((1 + 8 / sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T m2_error = 3 * T_ERR * m2 + (2 * m1 + m1_error) * m1_error;

  // If we are using extended precision, then it is worthwhile to recompute
  // the length of X more accurately.  Otherwise we use the fact that X is
  // guaranteed to be unit length to within a tolerance of 4 * DBL_ERR.
  if (T_ERR < DBL_ERR) {
    n2cos2_r *= x.Norm2();
    n2cos2_r_error += 4 * T_ERR * n2cos2_r;
  } else {
    n2cos2_r_error += 8 * DBL_ERR * n2cos2_r;
  }
  T diff = m2 - n2cos2_r;
  T error = m2_error + n2cos2_r_error;
  return (diff > error) ? -1 : (diff < -error) ? 1 : 0;
}